

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

vector<Tle,_std::allocator<Tle>_> *
readTLEs(vector<Tle,_std::allocator<Tle>_> *__return_storage_ptr__,string *fname,FILE *fp)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  ostream *poVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  undefined4 local_ec;
  string local_e8 [32];
  string local_c8 [32];
  long local_a8;
  size_type en;
  ulong local_90;
  size_t lineNo;
  string name;
  string line2;
  string line1;
  FILE *fp_local;
  string *fname_local;
  vector<Tle,_std::allocator<Tle>_> *tles;
  
  std::vector<Tle,_std::allocator<Tle>_>::vector(__return_storage_ptr__);
  std::__cxx11::string::string((string *)(line2.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(name.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&lineNo);
  local_90 = 0;
  do {
    bVar1 = readLine(fp,(string *)((long)&line2.field_2 + 8));
    if (!bVar1) {
LAB_00112bf7:
      local_ec = 1;
      std::__cxx11::string::~string((string *)&lineNo);
      std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(line2.field_2._M_local_buf + 8));
      return __return_storage_ptr__;
    }
    local_90 = local_90 + 1;
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)((long)&line2.field_2 + 8));
    iVar2 = isalpha((int)*pcVar3);
    if ((iVar2 != 0) || (uVar4 = std::__cxx11::string::size(), uVar4 < 0x19)) {
      std::__cxx11::string::operator=((string *)&lineNo,(string *)(line2.field_2._M_local_buf + 8));
    }
    local_a8 = std::__cxx11::string::find_last_not_of((char *)&lineNo,0x1276d2);
    if (local_a8 != -1) {
      std::__cxx11::string::substr((ulong)local_c8,(ulong)&lineNo);
      std::__cxx11::string::operator=((string *)&lineNo,local_c8);
      std::__cxx11::string::~string(local_c8);
    }
    uVar4 = std::__cxx11::string::size();
    if (0x16 < uVar4) {
      std::__cxx11::string::substr((ulong)local_e8,(ulong)&lineNo);
      std::__cxx11::string::operator=((string *)&lineNo,local_e8);
      std::__cxx11::string::~string(local_e8);
    }
    local_90 = local_90 + 1;
    bVar1 = readLine(fp,(string *)((long)&line2.field_2 + 8));
    if (!bVar1) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Unexpected error reading TLE line 1 at line ")
      ;
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_90);
      poVar5 = std::operator<<(poVar5," in ");
      poVar5 = std::operator<<(poVar5,(string *)fname);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      goto LAB_00112bf7;
    }
    local_90 = local_90 + 1;
    bVar1 = readLine(fp,(string *)((long)&name.field_2 + 8));
    if (!bVar1) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Unexpected error reading TLE line 2 at line ")
      ;
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_90);
      poVar5 = std::operator<<(poVar5," in ");
      poVar5 = std::operator<<(poVar5,(string *)fname);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      goto LAB_00112bf7;
    }
    std::__cxx11::string::substr((ulong)&local_110,(ulong)((long)&line2.field_2 + 8));
    std::__cxx11::string::substr((ulong)&local_130,(ulong)((long)&name.field_2 + 8));
    std::vector<Tle,std::allocator<Tle>>::
    emplace_back<std::__cxx11::string&,std::__cxx11::string,std::__cxx11::string>
              ((vector<Tle,std::allocator<Tle>> *)__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lineNo,
               &local_110,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::clear();
  } while( true );
}

Assistant:

static std::vector<Tle> readTLEs(const std::string &fname, FILE *fp) {
  std::vector<Tle> tles;
  std::string line1, line2, name;
  size_t lineNo = 0;

  while (readLine(fp, line1)) {
    ++lineNo;
    if (std::isalpha(line1[0]) || line1.size() <= 24)
      name = line1;
    // Trim trailing whitespace from name.
    auto en = name.find_last_not_of(" \t\r\n");
    if (en != std::string::npos)
      name = name.substr(0, en + 1);
    // Celestrak and wikipedia say that names are 24 bytes, libsgp4 says 22.
    if (name.size() > 22)
      name = name.substr(0, 22);
    ++lineNo;
    if (!readLine(fp, line1)) {
      std::cerr << "Unexpected error reading TLE line 1 at line " << lineNo
                << " in " << fname << std::endl;
      return tles;
    }
    ++lineNo;
    if (!readLine(fp, line2)) {
      std::cerr << "Unexpected error reading TLE line 2 at line " << lineNo
                << " in " << fname << std::endl;
      return tles;
    }

    tles.emplace_back(name, line1.substr(0, 69), line2.substr(0, 69));
    name.clear();
  }

  return tles;
}